

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS ref_sort_heap_dbl(REF_INT n,REF_DBL *original,REF_INT *sorted_index)

{
  double local_40;
  REF_DBL q;
  int local_30;
  REF_INT indxt;
  REF_INT ir;
  REF_INT l;
  REF_INT j;
  REF_INT i;
  REF_INT *sorted_index_local;
  REF_DBL *original_local;
  REF_INT n_local;
  
  for (l = 0; l < n; l = l + 1) {
    sorted_index[l] = l;
  }
  if (n < 2) {
    return 0;
  }
  indxt = (n >> 1) + 1;
  local_30 = n + -1;
  do {
    if (indxt < 2) {
      q._4_4_ = sorted_index[local_30];
      local_40 = original[q._4_4_];
      sorted_index[local_30] = *sorted_index;
      local_30 = local_30 + -1;
      if (local_30 == 0) {
        *sorted_index = q._4_4_;
        return 0;
      }
    }
    else {
      q._4_4_ = sorted_index[indxt + -2];
      local_40 = original[q._4_4_];
      indxt = indxt + -1;
    }
    l = indxt + -1;
    for (ir = indxt + l; ir <= local_30; ir = (ir + 1) * 2 + -1) {
      if ((ir < local_30) && (original[sorted_index[ir]] < original[sorted_index[ir + 1]])) {
        ir = ir + 1;
      }
      if (original[sorted_index[ir]] <= local_40) break;
      sorted_index[l] = sorted_index[ir];
      l = ir;
    }
    sorted_index[l] = q._4_4_;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_sort_heap_dbl(REF_INT n, REF_DBL *original,
                                     REF_INT *sorted_index) {
  REF_INT i, j, l, ir, indxt;
  REF_DBL q;

  for (i = 0; i < n; i++) sorted_index[i] = i;

  if (n < 2) return REF_SUCCESS;

  l = (n >> 1) + 1;
  ir = n - 1;
  for (;;) {
    if (l > 1) {
      l--;
      indxt = sorted_index[l - 1];
      q = original[indxt];
    } else {
      indxt = sorted_index[ir];
      q = original[indxt];
      sorted_index[ir] = sorted_index[0];
      if (--ir == 0) {
        sorted_index[0] = indxt;
        break;
      }
    }
    i = l - 1;
    j = l + i;

    while (j <= ir) {
      if (j < ir) {
        if (original[sorted_index[j]] < original[sorted_index[j + 1]]) j++;
      }
      if (q < original[sorted_index[j]]) {
        sorted_index[i] = sorted_index[j];
        i = j;

        j++;
        j <<= 1;
        j--;

      } else
        break;
    }
    sorted_index[i] = indxt;
  }

  return REF_SUCCESS;
}